

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashedSimplePairCache.cpp
# Opt level: O2

void * __thiscall
cbtHashedSimplePairCache::removeOverlappingPair
          (cbtHashedSimplePairCache *this,int indexA,int indexB)

{
  long lVar1;
  int iVar2;
  cbtSimplePair *pcVar3;
  int *piVar4;
  anon_union_8_2_fce4e415_for_cbtSimplePair_2 aVar5;
  uint uVar6;
  cbtSimplePair *pcVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  int *piVar11;
  long lVar12;
  void *pvVar13;
  int iVar14;
  
  uVar6 = getHash(this,indexA,indexB);
  uVar10 = (long)(int)uVar6 & (long)(this->m_overlappingPairArray).m_capacity - 1U;
  pcVar7 = internalFindPair(this,indexA,indexB,(int)uVar10);
  if (pcVar7 == (cbtSimplePair *)0x0) {
    pvVar13 = (void *)0x0;
  }
  else {
    pvVar13 = (pcVar7->field_2).m_userPointer;
    pcVar3 = (this->m_overlappingPairArray).m_data;
    piVar4 = (this->m_next).m_data;
    iVar14 = (int)((ulong)((long)pcVar7 - (long)pcVar3) >> 4);
    piVar11 = (this->m_hashTable).m_data + uVar10;
    piVar9 = piVar11;
    iVar8 = -1;
    while (iVar2 = *piVar9, iVar2 != iVar14) {
      iVar8 = iVar2;
      piVar9 = piVar4 + iVar2;
    }
    piVar9 = piVar4 + iVar8;
    if (iVar8 == -1) {
      piVar9 = piVar11;
    }
    *piVar9 = piVar4[iVar14];
    lVar12 = (long)(this->m_overlappingPairArray).m_size;
    lVar1 = lVar12 + -1;
    if ((int)lVar1 != iVar14) {
      uVar6 = getHash(this,pcVar3[lVar1].m_indexA,pcVar3[lVar1].m_indexB);
      piVar4 = (this->m_next).m_data;
      uVar10 = (long)(int)uVar6 & (long)(this->m_overlappingPairArray).m_capacity - 1U;
      piVar11 = (this->m_hashTable).m_data + uVar10;
      piVar9 = piVar11;
      iVar8 = -1;
      while (iVar2 = *piVar9, iVar2 != (int)lVar1) {
        iVar8 = iVar2;
        piVar9 = piVar4 + iVar2;
      }
      piVar9 = piVar4 + iVar8;
      if (iVar8 == -1) {
        piVar9 = piVar11;
      }
      *piVar9 = piVar4[lVar12 + -1];
      pcVar3 = (this->m_overlappingPairArray).m_data;
      pcVar7 = pcVar3 + lVar1;
      iVar8 = pcVar7->m_indexB;
      aVar5 = pcVar7->field_2;
      pcVar3 = pcVar3 + iVar14;
      pcVar3->m_indexA = pcVar7->m_indexA;
      pcVar3->m_indexB = iVar8;
      pcVar3->field_2 = aVar5;
      piVar9 = (this->m_hashTable).m_data;
      (this->m_next).m_data[iVar14] = piVar9[uVar10];
      piVar9[uVar10] = iVar14;
      iVar14 = (this->m_overlappingPairArray).m_size + -1;
    }
    (this->m_overlappingPairArray).m_size = iVar14;
  }
  return pvVar13;
}

Assistant:

void* cbtHashedSimplePairCache::removeOverlappingPair(int indexA, int indexB)
{
#ifdef BT_DEBUG_COLLISION_PAIRS
	gRemoveSimplePairs++;
#endif

	/*if (indexA > indexB) 
		cbtSwap(indexA, indexB);*/

	int hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA), static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity() - 1));

	cbtSimplePair* pair = internalFindPair(indexA, indexB, hash);
	if (pair == NULL)
	{
		return 0;
	}

	void* userData = pair->m_userPointer;

	int pairIndex = int(pair - &m_overlappingPairArray[0]);
	cbtAssert(pairIndex < m_overlappingPairArray.size());

	// Remove the pair from the hash table.
	int index = m_hashTable[hash];
	cbtAssert(index != BT_SIMPLE_NULL_PAIR);

	int previous = BT_SIMPLE_NULL_PAIR;
	while (index != pairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_SIMPLE_NULL_PAIR)
	{
		cbtAssert(m_next[previous] == pairIndex);
		m_next[previous] = m_next[pairIndex];
	}
	else
	{
		m_hashTable[hash] = m_next[pairIndex];
	}

	// We now move the last pair into spot of the
	// pair being removed. We need to fix the hash
	// table indices to support the move.

	int lastPairIndex = m_overlappingPairArray.size() - 1;

	// If the removed pair is the last pair, we are done.
	if (lastPairIndex == pairIndex)
	{
		m_overlappingPairArray.pop_back();
		return userData;
	}

	// Remove the last pair from the hash table.
	const cbtSimplePair* last = &m_overlappingPairArray[lastPairIndex];
	/* missing swap here too, Nat. */
	int lastHash = static_cast<int>(getHash(static_cast<unsigned int>(last->m_indexA), static_cast<unsigned int>(last->m_indexB)) & (m_overlappingPairArray.capacity() - 1));

	index = m_hashTable[lastHash];
	cbtAssert(index != BT_SIMPLE_NULL_PAIR);

	previous = BT_SIMPLE_NULL_PAIR;
	while (index != lastPairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_SIMPLE_NULL_PAIR)
	{
		cbtAssert(m_next[previous] == lastPairIndex);
		m_next[previous] = m_next[lastPairIndex];
	}
	else
	{
		m_hashTable[lastHash] = m_next[lastPairIndex];
	}

	// Copy the last pair into the remove pair's spot.
	m_overlappingPairArray[pairIndex] = m_overlappingPairArray[lastPairIndex];

	// Insert the last pair into the hash table
	m_next[pairIndex] = m_hashTable[lastHash];
	m_hashTable[lastHash] = pairIndex;

	m_overlappingPairArray.pop_back();

	return userData;
}